

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonCodec.cc
# Opt level: O1

size_t __thiscall
avro::parsing::JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_>::mapNext
          (JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_> *this)

{
  SimpleParser<avro::parsing::JsonDecoderHandler> *this_00;
  Token TVar1;
  size_t sVar2;
  
  this_00 = &this->parser_;
  SimpleParser<avro::parsing::JsonDecoderHandler>::processImplicitActions(this_00);
  if ((this->in_).peeked == false) {
    TVar1 = json::JsonParser::doAdvance(&this->in_);
    (this->in_).curToken = TVar1;
    (this->in_).peeked = true;
  }
  if ((this->in_).curToken == tkObjectEnd) {
    if ((this->in_).peeked == false) {
      TVar1 = json::JsonParser::doAdvance(&this->in_);
      (this->in_).curToken = TVar1;
    }
    else {
      (this->in_).peeked = false;
    }
    SimpleParser<avro::parsing::JsonDecoderHandler>::popRepeater(this_00);
    SimpleParser<avro::parsing::JsonDecoderHandler>::advance(this_00,sMapEnd);
    sVar2 = 0;
  }
  else {
    sVar2 = 1;
    SimpleParser<avro::parsing::JsonDecoderHandler>::setRepeatCount(this_00,1);
  }
  return sVar2;
}

Assistant:

size_t JsonDecoder<P>::mapNext()
{
    parser_.processImplicitActions();
    if (in_.peek() == JsonParser::tkObjectEnd) {
        in_.advance();
        parser_.popRepeater();
        parser_.advance(Symbol::sMapEnd);
        return 0;
    }
    parser_.setRepeatCount(1);
    return 1;
}